

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O1

void __thiscall
DCACHE::dc_simulate_write
          (DCACHE *this,oraddr_t dataaddr,oraddr_t virt_addr,uint32_t data,int width,int data_ci)

{
  CPU *pCVar1;
  oraddr_t oVar2;
  int iVar3;
  BUS_DEVICE *pBVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  
  uVar10 = (ulong)dataaddr;
  pBVar4 = BUS::get_device((this->super_CACHE).bus_p,dataaddr);
  if (width == 4) {
    (*pBVar4->_vptr_BUS_DEVICE[5])(pBVar4,uVar10,(ulong)virt_addr,(ulong)data);
  }
  else if (width == 1) {
    (*pBVar4->_vptr_BUS_DEVICE[3])(pBVar4,uVar10,(ulong)virt_addr,(ulong)data & 0xff);
  }
  else if (width == 2) {
    (*pBVar4->_vptr_BUS_DEVICE[4])(pBVar4,uVar10,(ulong)virt_addr,(ulong)data & 0xffff);
  }
  pCVar1 = (this->super_CACHE).cpu;
  if ((pCVar1->sprs[1] & 2) == 0) {
    return;
  }
  if (data_ci != 0) {
    return;
  }
  if ((pCVar1->sprs[0x11] & 8) == 0) {
    return;
  }
  uVar5 = (ulong)(this->super_CACHE).nways;
  uVar12 = (this->super_CACHE).blocksize;
  uVar10 = uVar10 / uVar12;
  uVar14 = (ulong)(this->super_CACHE).nsets;
  iVar6 = (int)(uVar10 % uVar14);
  oVar2 = (oraddr_t)(uVar10 / uVar14);
  if (uVar5 == 0) {
    uVar15 = 0xffffffff;
  }
  else {
    uVar14 = 0xffffffff;
    uVar10 = 0;
    do {
      if (this->cache_mem[uVar10].cache_set[iVar6].tagaddr == oVar2) {
        uVar14 = uVar10 & 0xffffffff;
      }
      uVar15 = (uint)uVar14;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  if ((int)uVar15 < 0) {
    uVar10 = 0;
    if (uVar5 != 0) {
      uVar14 = 0;
      do {
        if (this->cache_mem[uVar14].cache_set[iVar6].lru < (int)((this->super_CACHE).ustates - 1)) {
          uVar10 = uVar14 & 0xffffffff;
        }
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
      uVar10 = (ulong)(int)uVar10;
    }
    uVar12 = (this->super_CACHE).blocksize;
    if (uVar12 != 0) {
      uVar15 = 0;
      do {
        uVar8 = (dataaddr & 0xfffffffc) + uVar15;
        pBVar4 = BUS::get_device((this->super_CACHE).bus_p,
                                 (uVar12 - 1 & uVar8) + (-uVar12 & dataaddr));
        uVar12 = (this->super_CACHE).blocksize;
        iVar3 = (*pBVar4->_vptr_BUS_DEVICE[2])
                          (pBVar4,(ulong)((uVar12 - 1 & uVar8) + (-uVar12 & dataaddr)),0);
        *(int *)((long)this->cache_mem[uVar10].cache_set[iVar6].line +
                (ulong)((this->super_CACHE).blocksize - 1 & uVar15 + dataaddr & 0xfffffffc)) = iVar3
        ;
        uVar15 = uVar15 + 4;
        uVar12 = (this->super_CACHE).blocksize;
      } while (uVar15 < uVar12);
    }
    this->cache_mem[uVar10].cache_set[iVar6].tagaddr = oVar2;
    uVar14 = (ulong)(this->super_CACHE).nways;
    if (uVar14 != 0) {
      lVar13 = 0;
      do {
        iVar3 = this->cache_mem[lVar13].cache_set[iVar6].lru;
        if (iVar3 != 0) {
          this->cache_mem[lVar13].cache_set[iVar6].lru = iVar3 + -1;
        }
        lVar13 = lVar13 + 1;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    this->cache_mem[uVar10].cache_set[iVar6].lru = (this->super_CACHE).ustates - 1;
    return;
  }
  if (uVar5 != 0) {
    lVar13 = 0;
    do {
      iVar3 = this->cache_mem[lVar13].cache_set[iVar6].lru;
      if (this->cache_mem[uVar15].cache_set[iVar6].lru < iVar3) {
        this->cache_mem[lVar13].cache_set[iVar6].lru = iVar3 + -1;
      }
      lVar13 = lVar13 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  uVar8 = uVar12 - 1 & dataaddr;
  this->cache_mem[uVar15].cache_set[iVar6].lru = (this->super_CACHE).ustates - 1;
  uVar12 = data;
  if (width != 4) {
    uVar12 = *(uint *)((long)this->cache_mem[uVar15].cache_set[iVar6].line +
                      (ulong)(uVar8 & 0xfffffffc));
    if (width == 1) {
      bVar7 = ~(byte)(dataaddr << 3) & 0x18;
      uVar11 = data & 0xff;
      uVar9 = ~(0xff << bVar7);
    }
    else {
      if (width != 2) goto LAB_0010480c;
      bVar7 = (byte)(dataaddr << 3) & 0x10;
      uVar11 = data & 0xffff;
      uVar9 = 0xffff << bVar7;
      bVar7 = bVar7 ^ 0x10;
    }
    uVar12 = uVar11 << bVar7 | uVar12 & uVar9;
  }
LAB_0010480c:
  this->cache_mem[uVar15].cache_set[iVar6].line[uVar8 >> 2] = uVar12;
  return;
}

Assistant:

void DCACHE::dc_simulate_write(oraddr_t dataaddr, oraddr_t virt_addr, uint32_t data, int width, int data_ci)
{
    int set, way = -1;
    int i;
    oraddr_t tagaddr;
    uint32_t tmp;
    BUS_DEVICE * device;
    device = bus_p->get_device(dataaddr);

    if (width == 4)
        device->Write32(dataaddr, virt_addr, data);
    else if (width == 2)
        device->Write16(dataaddr, virt_addr, data);
    else if (width == 1)
        device->Write8(dataaddr, virt_addr, data);

    if (!(cpu->sprs[SPR_UPR] & SPR_UPR_DCP) ||
        !(cpu->sprs[SPR_SR] & SPR_SR_DCE) || data_ci)
        return;

    /* Which set to check out? */
    set = (dataaddr / blocksize) % nsets;
    tagaddr = (dataaddr / blocksize) / nsets;

    /* Scan all ways and try to find a matching way. */
    for (i = 0; i < nways; i++)
        if (cache_mem[i].cache_set[set].tagaddr == tagaddr)
            way = i;
    
    /* Did we find our cached data? */
    if (way >= 0)
    { /* Yes, we did. */
        // dc_stats.writehit++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru > cache_mem[way].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[way].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_hitdelay;

        tmp =
            cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2];
        if (width == 4)
            tmp = data;
        else if (width == 2)
        {
            tmp &= 0xffff << ((dataaddr & 2) ? 16 : 0);
            tmp |= (data & 0xffff) << ((dataaddr & 2) ? 0 : 16);
        }
        else if (width == 1)
        {
            tmp &= ~(0xff << (8 * (3 - (dataaddr & 3))));
            tmp |= (data & 0xff) << (8 * (3 - (dataaddr & 3)));
        }
        cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2] =
            tmp;
    }
    else
    { /* No, we didn't. */
        int minlru = ustates - 1;
        int minway = 0;

        // dc_stats.writemiss++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru < minlru)
                minway = i;

        for (i = 0; i < (blocksize); i += 4)
        {
            device = bus_p->get_device((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)));
            cache_mem[minway].cache_set[set].line[((dataaddr + i) & (blocksize - 1)) >> 2] =
                /* FIXME: Same comment as in dc_simulate_read */
                device->Read32((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)), 0);

        }

        cache_mem[minway].cache_set[set].tagaddr = tagaddr;
        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[minway].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_missdelay;

        // if (config.pcu.enabled)
        //     pcu_count_event(SPR_PCMR_DCM);
    }
}